

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O2

int __thiscall mario::EPoller::poll(EPoller *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  epoll_event *__events;
  int iVar1;
  Timestamp TVar2;
  Writer *pWVar3;
  int numEvents;
  Writer local_a0;
  
  __events = (epoll_event *)
             (this->_events).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
             super__Vector_impl_data._M_start;
  iVar1 = epoll_wait(this->_epollfd,__events,
                     (int)(((long)(this->_events).
                                  super__Vector_base<epoll_event,_std::allocator<epoll_event>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)__events) / 0xc)
                     ,(int)__fds);
  numEvents = iVar1;
  TVar2 = Timestamp::now();
  if (iVar1 < 1) {
    if (iVar1 == 0) {
      local_a0._vptr_Writer = (_func_int **)&PTR__Writer_0012cdd0;
      local_a0.m_msg = (LogMessage *)0x0;
      local_a0.m_level = Info;
      local_a0.m_file =
           "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/EPoller.cpp"
      ;
      local_a0.m_line = 0x2c;
      local_a0.m_func = "Timestamp mario::EPoller::poll(int, ChannelList *)";
      local_a0.m_verboseLevel = 0;
      local_a0.m_logger = (Logger *)0x0;
      local_a0.m_proceed = false;
      local_a0.m_messageBuilder.m_logger = (Logger *)0x0;
      local_a0.m_messageBuilder.m_containerLogSeperator = "";
      local_a0.m_dispatchAction = NormalLog;
      local_a0.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a0.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a0.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pWVar3 = el::base::Writer::construct(&local_a0,1,"default");
      el::base::Writer::operator<<(pWVar3,(char (*) [18])"nothing happended");
    }
    else {
      local_a0._vptr_Writer = (_func_int **)&PTR__Writer_0012cdd0;
      local_a0.m_msg = (LogMessage *)0x0;
      local_a0.m_level = Fatal;
      local_a0.m_file =
           "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/EPoller.cpp"
      ;
      local_a0.m_line = 0x2e;
      local_a0.m_func = "Timestamp mario::EPoller::poll(int, ChannelList *)";
      local_a0.m_verboseLevel = 0;
      local_a0.m_logger = (Logger *)0x0;
      local_a0.m_proceed = false;
      local_a0.m_messageBuilder.m_logger = (Logger *)0x0;
      local_a0.m_messageBuilder.m_containerLogSeperator = "";
      local_a0.m_dispatchAction = NormalLog;
      local_a0.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a0.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a0.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pWVar3 = el::base::Writer::construct(&local_a0,1,"default");
      el::base::Writer::operator<<(pWVar3,(char (*) [16])"EPoller::poll()");
    }
    el::base::Writer::~Writer(&local_a0);
  }
  else {
    local_a0._vptr_Writer = (_func_int **)&PTR__Writer_0012cdd0;
    local_a0.m_msg = (LogMessage *)0x0;
    local_a0.m_level = Info;
    local_a0.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/EPoller.cpp"
    ;
    local_a0.m_line = 0x26;
    local_a0.m_func = "Timestamp mario::EPoller::poll(int, ChannelList *)";
    local_a0.m_verboseLevel = 0;
    local_a0.m_logger = (Logger *)0x0;
    local_a0.m_proceed = false;
    local_a0.m_messageBuilder.m_logger = (Logger *)0x0;
    local_a0.m_messageBuilder.m_containerLogSeperator = "";
    local_a0.m_dispatchAction = NormalLog;
    local_a0.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a0.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a0.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar3 = el::base::Writer::construct(&local_a0,1,"default");
    pWVar3 = el::base::Writer::operator<<(pWVar3,&numEvents);
    el::base::Writer::operator<<(pWVar3,(char (*) [17])"events happended");
    el::base::Writer::~Writer(&local_a0);
    fillActiveChannels(this,numEvents,(ChannelList *)__nfds);
    if (((long)(this->_events).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl
               .super__Vector_impl_data._M_finish -
        (long)(this->_events).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
              super__Vector_impl_data._M_start) / 0xc == (long)numEvents) {
      std::vector<epoll_event,_std::allocator<epoll_event>_>::resize
                (&this->_events,(long)numEvents * 2);
    }
  }
  return (int)TVar2._microSecondsSinceEpoch;
}

Assistant:

Timestamp EPoller::poll(int timeoutMs, ChannelList* activeChannels) {
    int numEvents = ::epoll_wait(_epollfd,
            _events.data(),
            _events.size(),
            timeoutMs);
    Timestamp now(Timestamp::now());
    if (numEvents > 0) {
        LOG(INFO) << numEvents << "events happended";
        fillActiveChannels(numEvents, activeChannels);
        if (numEvents == _events.size()) {
            _events.resize(_events.size() * 2);
        }
    } else if (numEvents == 0) {
        LOG(INFO) << "nothing happended";
    } else {
        LOG(FATAL) << "EPoller::poll()";
    }
    return now;
}